

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

uint uv_available_parallelism(void)

{
  int iVar1;
  long local_90;
  long rc;
  cpu_set_t set;
  
  memset(&rc,0,0x80);
  iVar1 = sched_getaffinity(0,0x80,(cpu_set_t *)&rc);
  if (iVar1 == 0) {
    iVar1 = __sched_cpucount(0x80,(cpu_set_t *)&rc);
    local_90 = (long)iVar1;
  }
  else {
    local_90 = sysconf(0x54);
  }
  if (local_90 < 1) {
    local_90 = 1;
  }
  return (uint)local_90;
}

Assistant:

unsigned int uv_available_parallelism(void) {
#ifdef __linux__
  cpu_set_t set;
  long rc;

  memset(&set, 0, sizeof(set));

  /* sysconf(_SC_NPROCESSORS_ONLN) in musl calls sched_getaffinity() but in
   * glibc it's... complicated... so for consistency try sched_getaffinity()
   * before falling back to sysconf(_SC_NPROCESSORS_ONLN).
   */
  if (0 == sched_getaffinity(0, sizeof(set), &set))
    rc = CPU_COUNT(&set);
  else
    rc = sysconf(_SC_NPROCESSORS_ONLN);

  if (rc < 1)
    rc = 1;

  return (unsigned) rc;
#elif defined(__MVS__)
  int rc;

  rc = __get_num_online_cpus();
  if (rc < 1)
    rc = 1;

  return (unsigned) rc;
#else  /* __linux__ */
  long rc;

  rc = sysconf(_SC_NPROCESSORS_ONLN);
  if (rc < 1)
    rc = 1;

  return (unsigned) rc;
#endif  /* __linux__ */
}